

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgReorderFGrps(Abc_TgMan_t *pMan)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  uVar3 = 0;
  if (pMan->fPhased == 0) {
    uVar3 = (uint)pMan->pGroup[0].nGVars;
  }
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  do {
    if (uVar2 == uVar4) {
      return;
    }
    cVar1 = pMan->pPerm[uVar2];
    uVar5 = uVar2 & 0xffffffff;
    while (uVar3 = (uint)uVar5, 0 < (int)uVar3) {
      if (pMan->symPhase[pMan->pFGrps[uVar5 - 1]] <= pMan->symPhase[cVar1]) goto LAB_00430648;
      pMan->pFGrps[uVar5] = pMan->pFGrps[uVar5 - 1];
      uVar5 = (ulong)(uVar3 - 1);
    }
    uVar3 = 0;
LAB_00430648:
    pMan->pFGrps[uVar3] = cVar1;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static void Abc_TgReorderFGrps(Abc_TgMan_t * pMan)
{
    char * pFGrps = pMan->pFGrps;
    int i, j, n = pMan->fPhased ? 0 : pMan->pGroup->nGVars;

    // sort by symPhase
    for (i = 0; i < n; i++)
    {
        char iv = pMan->pPerm[i];
        for (j = i; j > 0 && pMan->symPhase[(int)pFGrps[j - 1]] > pMan->symPhase[(int)iv]; j--)
            pFGrps[j] = pFGrps[j - 1];
        pFGrps[j] = iv;
    }
}